

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall Sampling_CatmullRom_Test::TestBody(Sampling_CatmullRom_Test *this)

{
  span<const_float> f;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  span<float> cdf_00;
  span<const_float> values_00;
  span<const_float> x;
  span<const_float> f_00;
  bool bVar1;
  size_type sVar2;
  Message *pMVar3;
  int iVar4;
  Float FVar5;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Float dx;
  Float dp;
  Float cx;
  Float cp;
  Float u;
  Uniform1DIter __end1;
  Uniform1DIter __begin1;
  Uniform1D *__range1;
  PiecewiseConstant1D distrib;
  anon_class_16_2_12372d88 cr;
  vector<float,_std::allocator<float>_> cdf;
  vector<float,_std::allocator<float>_> values;
  vector<float,_std::allocator<float>_> nodes;
  Uniform1DIter *in_stack_fffffffffffffc98;
  PiecewiseConstant1D *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  Allocator in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffcc0;
  allocator_type *in_stack_fffffffffffffcc8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  float in_stack_fffffffffffffcdc;
  Float *in_stack_fffffffffffffce0;
  Message *in_stack_fffffffffffffce8;
  PiecewiseConstant1D *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  AssertHelper *this_00;
  int nSteps;
  function<float_(float)> *f_01;
  Allocator alloc;
  float *pfVar6;
  size_t in_stack_fffffffffffffd48;
  double *in_stack_fffffffffffffd50;
  float *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  float in_stack_fffffffffffffd64;
  char *in_stack_fffffffffffffd68;
  AssertionResult local_268;
  Float local_258;
  float local_254;
  Float in_stack_fffffffffffffdcc;
  span<const_float> in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffde0;
  Float in_stack_fffffffffffffde4;
  float in_stack_fffffffffffffde8;
  Float FVar7;
  span<const_float> in_stack_fffffffffffffdf0;
  IndexingIterator<pbrt::detail::Uniform1DIter> local_1f8;
  Float *in_stack_fffffffffffffe10;
  Float *in_stack_fffffffffffffe18;
  undefined1 local_1e0 [24];
  undefined1 *local_1c8;
  AssertHelper local_1b0 [10];
  undefined1 local_160 [80];
  undefined1 *local_110;
  vector<float,_std::allocator<float>_> *local_108;
  function<float_(float)> local_c9;
  undefined1 local_a9;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined8 *local_88;
  undefined8 local_80;
  vector<float,_std::allocator<float>_> local_78;
  undefined1 local_49;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined8 *local_30;
  undefined8 local_28;
  undefined1 local_20 [32];
  
  local_48 = 0x3dcccccd00000000;
  uStack_40 = 0x3f6147ae3ecccccd;
  local_38 = 0x3f800000;
  local_30 = &local_48;
  local_28 = 5;
  pfVar6 = (float *)&local_49;
  std::allocator<float>::allocator((allocator<float> *)0x63f92c);
  __l._M_array._4_4_ = in_stack_fffffffffffffcdc;
  __l._M_array._0_4_ = in_stack_fffffffffffffcd8;
  __l._M_len = (size_type)in_stack_fffffffffffffce0;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffcd0,__l,in_stack_fffffffffffffcc8);
  std::allocator<float>::~allocator((allocator<float> *)0x63f960);
  local_a8 = 0x40a0000000000000;
  uStack_a0 = 0x4120000040000000;
  local_98 = 0x40a00000;
  local_88 = &local_a8;
  local_80 = 5;
  alloc.memoryResource = (memory_resource *)&local_a9;
  std::allocator<float>::allocator((allocator<float> *)0x63f9ad);
  __l_00._M_array._4_4_ = in_stack_fffffffffffffcdc;
  __l_00._M_array._0_4_ = in_stack_fffffffffffffcd8;
  __l_00._M_len = (size_type)in_stack_fffffffffffffce0;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffcd0,__l_00,in_stack_fffffffffffffcc8);
  std::allocator<float>::~allocator((allocator<float> *)0x63f9e1);
  sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_78);
  iVar4 = (int)sVar2;
  nSteps = (int)(sVar2 >> 0x20);
  f_01 = &local_c9;
  std::allocator<float>::allocator((allocator<float> *)0x63fa0b);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffcc0,CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)
             ,(allocator_type *)in_stack_fffffffffffffcb0.memoryResource);
  std::allocator<float>::~allocator((allocator<float> *)0x63fa37);
  pstd::span<float_const>::
  span<std::vector<float,std::allocator<float>>,void,std::vector<float,std::allocator<float>>>
            ((span<const_float> *)in_stack_fffffffffffffcb0.memoryResource,
             (vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  pstd::span<float_const>::
  span<std::vector<float,std::allocator<float>>,void,std::vector<float,std::allocator<float>>>
            ((span<const_float> *)in_stack_fffffffffffffcb0.memoryResource,
             (vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  pstd::span<float>::
  span<std::vector<float,std::allocator<float>>,void,std::vector<float,std::allocator<float>>>
            ((span<float> *)in_stack_fffffffffffffcb0.memoryResource,
             (vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  x.n = in_stack_fffffffffffffd48;
  x.ptr = pfVar6;
  values_00.n = (size_t)alloc.memoryResource;
  values_00.ptr = (float *)f_01;
  cdf_00.ptr._4_4_ = in_stack_fffffffffffffd24;
  cdf_00.ptr._0_4_ = in_stack_fffffffffffffd20;
  cdf_00.n._0_4_ = iVar4;
  cdf_00.n._4_4_ = nSteps;
  pbrt::IntegrateCatmullRom(x,values_00,cdf_00);
  local_110 = local_20;
  local_108 = &local_78;
  this_00 = local_1b0;
  std::function<float(float)>::function<Sampling_CatmullRom_Test::TestBody()::__0&,void>
            ((function<float_(float)> *)in_stack_fffffffffffffcb0.memoryResource,
             (anon_class_16_2_12372d88 *)
             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffca0);
  pbrt::Sample1DFunction(f_01,nSteps,iVar4,(Float)((ulong)this_00 >> 0x20),SUB84(this_00,0),alloc);
  pstd::span<float_const>::
  span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
            ((span<const_float> *)in_stack_fffffffffffffcb0.memoryResource,
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffca0);
  f.ptr._4_4_ = in_stack_fffffffffffffcbc;
  f.ptr._0_4_ = in_stack_fffffffffffffcb8;
  f.n = (size_t)in_stack_fffffffffffffcc0;
  pbrt::PiecewiseConstant1D::PiecewiseConstant1D
            ((PiecewiseConstant1D *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),f,
             in_stack_fffffffffffffcb0);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            (&in_stack_fffffffffffffca0->func);
  std::function<float_(float)>::~function((function<float_(float)> *)0x63fb8f);
  pbrt::Uniform1D::RNGGenerator
            ((Uniform1D *)in_stack_fffffffffffffcb0.memoryResource,in_stack_fffffffffffffcac,
             (uint64_t)in_stack_fffffffffffffca0,(uint64_t)in_stack_fffffffffffffc98);
  local_1c8 = local_1e0;
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
            ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
             in_stack_fffffffffffffca0);
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
            ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
             in_stack_fffffffffffffca0);
  while( true ) {
    bVar1 = pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator!=
                      ((IndexingIterator<pbrt::detail::Uniform1DIter> *)in_stack_fffffffffffffca0,
                       in_stack_fffffffffffffc98);
    in_stack_fffffffffffffd1c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd1c);
    if (!bVar1) break;
    FVar5 = pbrt::detail::Uniform1DIter::operator*((Uniform1DIter *)0x63fc2c);
    FVar7 = FVar5;
    pstd::span<float_const>::
    span<std::vector<float,std::allocator<float>>,void,std::vector<float,std::allocator<float>>>
              ((span<const_float> *)in_stack_fffffffffffffcb0.memoryResource,
               (vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    pstd::span<float_const>::
    span<std::vector<float,std::allocator<float>>,void,std::vector<float,std::allocator<float>>>
              ((span<const_float> *)in_stack_fffffffffffffcb0.memoryResource,
               (vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    pstd::span<float_const>::
    span<std::vector<float,std::allocator<float>>,void,std::vector<float,std::allocator<float>>>
              ((span<const_float> *)in_stack_fffffffffffffcb0.memoryResource,
               (vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    in_stack_fffffffffffffca0 = (PiecewiseConstant1D *)&stack0xfffffffffffffde8;
    in_stack_fffffffffffffc98 = (Uniform1DIter *)0x0;
    f_00.ptr._4_4_ = in_stack_fffffffffffffde4;
    f_00.ptr._0_4_ = in_stack_fffffffffffffde0;
    f_00.n._0_4_ = in_stack_fffffffffffffde8;
    f_00.n._4_4_ = FVar7;
    in_stack_fffffffffffffde4 =
         pbrt::SampleCatmullRom
                   (in_stack_fffffffffffffdf0,f_00,in_stack_fffffffffffffdd0,
                    in_stack_fffffffffffffdcc,in_stack_fffffffffffffe10,in_stack_fffffffffffffe18);
    iVar4 = (int)local_160;
    local_258 = pbrt::PiecewiseConstant1D::Sample
                          (in_stack_fffffffffffffcf0,
                           (Float)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                           in_stack_fffffffffffffce0,
                           (int *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    std::abs(iVar4);
    testing::internal::CmpHelperLT<float,double>
              (in_stack_fffffffffffffd68,
               (char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_268);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffcd0);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffca0,(char (*) [15])in_stack_fffffffffffffc98);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffca0,(float *)in_stack_fffffffffffffc98);
      in_stack_fffffffffffffcf0 =
           (PiecewiseConstant1D *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffca0,(char (*) [13])in_stack_fffffffffffffc98)
      ;
      in_stack_fffffffffffffce8 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffca0,(float *)in_stack_fffffffffffffc98);
      in_stack_fffffffffffffce0 =
           (Float *)testing::AssertionResult::failure_message((AssertionResult *)0x63ff49);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffcd0,
                 (Type)((ulong)in_stack_fffffffffffffcc8 >> 0x20),(char *)in_stack_fffffffffffffcc0,
                 in_stack_fffffffffffffcbc,(char *)in_stack_fffffffffffffcb0.memoryResource);
      testing::internal::AssertHelper::operator=
                (this_00,(Message *)CONCAT44(in_stack_fffffffffffffd1c,FVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffca0);
      testing::Message::~Message((Message *)0x63ffa3);
    }
    iVar4 = (int)&local_268;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x63fffb);
    in_stack_fffffffffffffcdc = in_stack_fffffffffffffde8 - local_254;
    std::abs(iVar4);
    in_stack_fffffffffffffd58 = (float *)0x3f689374bc6a7efa;
    in_stack_fffffffffffffd64 = in_stack_fffffffffffffcdc;
    testing::internal::CmpHelperLT<float,double>
              (in_stack_fffffffffffffd68,
               (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffd60),
               (float *)0x3f689374bc6a7efa,in_stack_fffffffffffffd50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd68);
    in_stack_fffffffffffffcd8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcd8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffcd0);
      in_stack_fffffffffffffcd0 =
           (vector<float,_std::allocator<float>_> *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffca0,(char (*) [19])in_stack_fffffffffffffc98)
      ;
      in_stack_fffffffffffffcc8 =
           (allocator_type *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffca0,(float *)in_stack_fffffffffffffc98);
      in_stack_fffffffffffffcc0 =
           (vector<float,_std::allocator<float>_> *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffca0,(char (*) [17])in_stack_fffffffffffffc98)
      ;
      pMVar3 = testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffca0,(float *)in_stack_fffffffffffffc98);
      in_stack_fffffffffffffcbc = (int)((ulong)pMVar3 >> 0x20);
      in_stack_fffffffffffffcb0.memoryResource =
           (memory_resource *)testing::AssertionResult::failure_message((AssertionResult *)0x64013a)
      ;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffcd0,
                 (Type)((ulong)in_stack_fffffffffffffcc8 >> 0x20),(char *)in_stack_fffffffffffffcc0,
                 in_stack_fffffffffffffcbc,(char *)in_stack_fffffffffffffcb0.memoryResource);
      testing::internal::AssertHelper::operator=
                (this_00,(Message *)CONCAT44(in_stack_fffffffffffffd1c,FVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffca0);
      testing::Message::~Message((Message *)0x640194);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x6401e9);
    pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator++(&local_1f8);
  }
  pbrt::PiecewiseConstant1D::~PiecewiseConstant1D(in_stack_fffffffffffffca0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcb0.memoryResource);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcb0.memoryResource);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcb0.memoryResource);
  return;
}

Assistant:

TEST(Sampling, CatmullRom) {
    std::vector<Float> nodes = {Float(0), Float(.1), Float(.4), Float(.88), Float(1)};
    std::vector<Float> values = {Float(0), Float(5), Float(2), Float(10), Float(5)};
    std::vector<Float> cdf(values.size());

    IntegrateCatmullRom(nodes, values, pstd::span<Float>(cdf));

    auto cr = [&](Float v) { return CatmullRom(nodes, values, v); };
    PiecewiseConstant1D distrib(Sample1DFunction(cr, 8192, 1024, 0.f, 1.f));
    for (Float u : Uniform1D(100)) {
        Float cp;
        Float cx = SampleCatmullRom(nodes, values, cdf, u, nullptr, &cp);

        Float dp;
        Float dx = distrib.Sample(u, &dp);
        EXPECT_LT(std::abs(cx - dx), 3e-3)
            << "Closed form = " << cx << ", distrib = " << dx;
        EXPECT_LT(std::abs(cp - dp), 3e-3)
            << "Closed form PDF = " << cp << ", distrib PDF = " << dp;
    }
}